

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_ChatLogging.cpp
# Opt level: O0

void __thiscall RenX_ChatLogPlugin::~RenX_ChatLogPlugin(RenX_ChatLogPlugin *this)

{
  byte bVar1;
  RenX_ChatLogPlugin *this_local;
  
  *(undefined ***)this = &PTR_think_0010e840;
  *(undefined ***)&this->field_0x8 = &PTR_OnRehash_0010ed20;
  bVar1 = std::fstream::is_open();
  if ((bVar1 & 1) != 0) {
    std::fstream::close();
  }
  std::fstream::~fstream(&this->fs);
  std::__cxx11::string::~string((string *)&this->last_date);
  RenX::Plugin::~Plugin(&this->super_Plugin);
  return;
}

Assistant:

RenX_ChatLogPlugin::~RenX_ChatLogPlugin()
{
	if (fs.is_open()) {
		fs.close();
	}
}